

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O1

char * mp_encode_str0(char *data,char *str)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  
  sVar2 = strlen(str);
  uVar1 = (uint)sVar2;
  if (uVar1 < 0x20) {
    *data = (byte)sVar2 | 0xa0;
    lVar3 = 1;
  }
  else if (uVar1 < 0x100) {
    *data = -0x27;
    data[1] = (byte)sVar2;
    lVar3 = 2;
  }
  else if (uVar1 < 0x10000) {
    *data = -0x26;
    *(ushort *)(data + 1) = (ushort)sVar2 << 8 | (ushort)sVar2 >> 8;
    lVar3 = 3;
  }
  else {
    *data = -0x25;
    *(uint *)(data + 1) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    lVar3 = 5;
  }
  memcpy(data + lVar3,str,sVar2 & 0xffffffff);
  return data + lVar3 + (sVar2 & 0xffffffff);
}

Assistant:

MP_IMPL char *
mp_encode_str0(char *data, const char *str)
{
	return mp_encode_str(data, str, strlen(str));
}